

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_optimizer_options.cpp
# Opt level: O2

spv_optimizer_options spvOptimizerOptionsCreate(void)

{
  spv_optimizer_options_t *this;
  
  this = (spv_optimizer_options_t *)operator_new(0x3c);
  spv_optimizer_options_t::spv_optimizer_options_t(this);
  return this;
}

Assistant:

SPIRV_TOOLS_EXPORT spv_optimizer_options spvOptimizerOptionsCreate(void) {
  return new spv_optimizer_options_t();
}